

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
::
linear_search_impl<int,absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,int>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
           *this,int *k,unsigned_long s,ulong e)

{
  ulong uVar1;
  
  uVar1 = s;
  if (s < e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, const google::protobuf::OneofDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, const google::protobuf::OneofDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = const char]"
                   );
    }
    this = this + s * 0x10;
    do {
      this = this + 0x10;
      if (*k <= *(int *)this) {
        return (SearchResult<unsigned_long,_false>)s;
      }
      s = s + 1;
      uVar1 = e;
    } while (e != s);
  }
  return (SearchResult<unsigned_long,_false>)uVar1;
}

Assistant:

SearchResult<size_type, false> linear_search_impl(
      const K &k, size_type s, const size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return SearchResult<size_type, false>{s};
  }